

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxAbs(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this)

{
  type_conflict5 tVar1;
  cpp_dec_float<100U,_int,_void> *in_RSI;
  cpp_dec_float<100U,_int,_void> *in_RDI;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *maxi;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffe38;
  cpp_dec_float<100U,_int,_void> *pcVar2;
  undefined1 local_1a8 [80];
  undefined1 local_158 [80];
  undefined1 local_108 [160];
  int local_68;
  undefined4 local_64 [5];
  undefined8 local_50;
  undefined4 *local_48;
  long local_38;
  undefined1 *local_30;
  long local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined4 *local_8;
  
  local_64[0] = 0;
  local_48 = local_64;
  local_50 = 0;
  pcVar2 = in_RDI;
  local_8 = local_48;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_RSI,(longlong)in_RDI,in_RDI);
  local_68 = size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_RSI);
  while (local_68 = local_68 + -1, -1 < local_68) {
    local_38 = *(long *)(in_RSI->data)._M_elems + (long)local_68 * 0x54;
    local_30 = local_108;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_RDI,in_stack_fffffffffffffe38);
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_fffffffffffffe38);
    tVar1 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffe38,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x4ff139);
    if (tVar1) {
      local_28 = *(long *)(in_RSI->data)._M_elems + (long)local_68 * 0x54;
      local_20 = local_1a8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_RDI,in_stack_fffffffffffffe38);
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_fffffffffffffe38);
      local_18 = local_158;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (in_RDI,in_stack_fffffffffffffe38);
    }
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)pcVar2;
}

Assistant:

R maxAbs() const
   {
      R maxi = 0;

      for(int i = size() - 1; i >= 0; --i)
      {
         if(spxAbs(m_elem[i].val) > maxi)
            maxi = spxAbs(m_elem[i].val);
      }

      assert(maxi >= 0);

      return maxi;
   }